

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corona_loader.cpp
# Opt level: O1

pair<embree::Ref<embree::SceneGraph::MaterialNode>,_embree::vector_t<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_embree::aligned_allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_16UL>_>_>
* __thiscall
embree::CoronaLoader::loadInstances
          (pair<embree::Ref<embree::SceneGraph::MaterialNode>,_embree::vector_t<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_embree::aligned_allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_16UL>_>_>
           *__return_storage_ptr__,CoronaLoader *this,Ref<embree::XML> *xml)

{
  string *__rhs;
  float *pfVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined4 *puVar4;
  XML *pXVar5;
  undefined8 uVar6;
  size_type sVar7;
  undefined8 ptr;
  pair<embree::Ref<embree::SceneGraph::MaterialNode>,_embree::vector_t<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_embree::aligned_allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_16UL>_>_>
  *ppVar8;
  int iVar9;
  Node *this_00;
  pointer pRVar10;
  long lVar11;
  runtime_error *prVar12;
  long *plVar13;
  ulong uVar14;
  size_type *psVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  char *this_01;
  ulong uVar17;
  undefined8 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  Ref<embree::SceneGraph::MaterialNode> material;
  Ref<embree::XML> child;
  Ref<embree::SceneGraph::MaterialNode> local_158;
  string local_150;
  Ref<embree::XML> local_130;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  undefined4 local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  undefined4 local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  pair<embree::Ref<embree::SceneGraph::MaterialNode>,_embree::vector_t<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_embree::aligned_allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_16UL>_>_>
  *local_e8;
  CoronaLoader *local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  string local_50;
  
  local_e0 = this;
  iVar9 = std::__cxx11::string::compare((char *)&xml->ptr->name);
  if (iVar9 != 0) {
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    ParseLocation::str_abi_cxx11_(&local_150,&xml->ptr->loc);
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_150);
    local_128._0_8_ = *plVar13;
    paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._0_8_ == paVar16) {
      local_118._M_allocated_capacity = paVar16->_M_allocated_capacity;
      local_118._8_8_ = plVar13[3];
      local_128._0_8_ = &local_118;
    }
    else {
      local_118._M_allocated_capacity = paVar16->_M_allocated_capacity;
    }
    local_128._8_8_ = plVar13[1];
    *plVar13 = (long)paVar16;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    std::runtime_error::runtime_error(prVar12,(string *)&local_128.field_1);
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this_00 = (Node *)alignedUSMMalloc(0x180,0x10,DEVICE_READ_ONLY);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"");
  local_e8 = __return_storage_ptr__;
  SceneGraph::Node::Node(this_00,&local_b8);
  (this_00->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__OBJMaterial_002cbaf0;
  *(undefined4 *)&this_00[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined4 *)&this_00[1].fileName._M_string_length = 0;
  *(undefined8 *)((long)&this_00[1].fileName._M_string_length + 4) = 0x3f8000003f800000;
  *(undefined4 *)((long)&this_00[1].fileName.field_2 + 4) = 0x3f800000;
  *(undefined8 *)((long)&this_00[1].fileName.field_2 + 8) = 0;
  this_00[1].name._M_dataplus._M_p = (pointer)0x0;
  this_00[1].name._M_string_length = 0x3f8000003f800000;
  this_00[1].name.field_2._M_allocated_capacity = 0x3f8000003f800000;
  *(undefined8 *)((long)&this_00[1].name.field_2 + 8) = 0;
  this_00[1].indegree = 0;
  this_00[1].closed = false;
  this_00[1].hasLightOrCamera = false;
  *(undefined2 *)&this_00[1].field_0x5a = 0x3f80;
  this_00[1].id = 0x3f800000;
  this_00[1].geometry = (void *)0x3f8000003f800000;
  memset(this_00 + 2,0,0xa8);
  local_158.ptr = (MaterialNode *)this_00;
  (*(this_00->super_RefCount)._vptr_RefCount[2])(this_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  local_150._M_string_length = 0;
  local_150.field_2._M_allocated_capacity = 0;
  local_150.field_2._8_8_ = (void *)0x0;
  pRVar10 = (xml->ptr->children).
            super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((xml->ptr->children).
      super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>.
      _M_impl.super__Vector_impl_data._M_finish != pRVar10) {
    uVar17 = 0;
    do {
      pXVar5 = pRVar10[uVar17].ptr;
      local_130.ptr = pXVar5;
      if (pXVar5 != (XML *)0x0) {
        (*(pXVar5->super_RefCount)._vptr_RefCount[2])(pXVar5);
      }
      __rhs = &pXVar5->name;
      iVar9 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar9 == 0) {
        loadMaterial((CoronaLoader *)&local_128.field_1,(Ref<embree::XML> *)local_e0);
        if (&(local_158.ptr)->super_Node != (Node *)0x0) {
          (*((local_158.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
        }
        local_158.ptr = (MaterialNode *)local_128._0_8_;
      }
      else {
        this_01 = "transform";
        iVar9 = std::__cxx11::string::compare((char *)__rhs);
        if (iVar9 != 0) {
          prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
          ParseLocation::str_abi_cxx11_(&local_50,&pXVar5->loc);
          plVar13 = (long *)std::__cxx11::string::append((char *)&local_50);
          local_d8._M_dataplus._M_p = (pointer)*plVar13;
          psVar15 = (size_type *)(plVar13 + 2);
          if ((size_type *)local_d8._M_dataplus._M_p == psVar15) {
            local_d8.field_2._M_allocated_capacity = *psVar15;
            local_d8.field_2._8_8_ = plVar13[3];
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          }
          else {
            local_d8.field_2._M_allocated_capacity = *psVar15;
          }
          local_d8._M_string_length = plVar13[1];
          *plVar13 = (long)psVar15;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_128.field_1,&local_d8,__rhs);
          std::runtime_error::runtime_error(prVar12,(string *)&local_128.field_1);
          __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        load<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>>>
                  ((AffineSpace3fa *)&local_128.field_1,(CoronaLoader *)this_01,&local_130);
        ptr = local_150.field_2._8_8_;
        sVar7 = local_150._M_string_length;
        uVar14 = local_150._M_string_length + 1;
        uVar18 = local_150.field_2._M_allocated_capacity;
        if ((local_150.field_2._M_allocated_capacity < uVar14) &&
           (uVar18 = uVar14, uVar6 = local_150.field_2._M_allocated_capacity,
           local_150.field_2._M_allocated_capacity != 0)) {
          for (; uVar18 = uVar6, (ulong)uVar6 < uVar14; uVar6 = uVar6 * 2 + (ulong)(uVar6 * 2 == 0))
          {
          }
        }
        uVar19 = local_128.m128[0];
        uVar20 = local_128.m128[1];
        uVar21 = local_128.m128[2];
        uVar22 = local_128.m128[3];
        uVar23 = local_118._M_allocated_capacity._0_4_;
        uVar24 = local_118._M_allocated_capacity._4_4_;
        uVar25 = local_118._8_4_;
        uVar26 = local_118._12_4_;
        uVar27 = local_108;
        uVar28 = uStack_104;
        uVar29 = uStack_100;
        uVar30 = uStack_fc;
        uVar31 = local_f8;
        uVar32 = uStack_f4;
        uVar33 = uStack_f0;
        uVar34 = uStack_ec;
        if (local_150.field_2._M_allocated_capacity != uVar18) {
          local_98 = local_f8;
          uStack_94 = uStack_f4;
          uStack_90 = uStack_f0;
          uStack_8c = uStack_ec;
          local_88 = local_108;
          uStack_84 = uStack_104;
          uStack_80 = uStack_100;
          uStack_7c = uStack_fc;
          local_78 = local_118._M_allocated_capacity._0_4_;
          uStack_74 = local_118._M_allocated_capacity._4_4_;
          uStack_70 = local_118._8_4_;
          uStack_6c = local_118._12_4_;
          local_68 = local_128.m128[0];
          fStack_64 = local_128.m128[1];
          fStack_60 = local_128.m128[2];
          fStack_5c = local_128.m128[3];
          local_150.field_2._8_8_ = alignedMalloc(uVar18 << 6,0x10);
          if (local_150._M_string_length != 0) {
            lVar11 = 0x30;
            uVar14 = 0;
            do {
              puVar2 = (undefined8 *)(ptr + -0x30 + lVar11);
              uVar6 = puVar2[1];
              puVar3 = (undefined8 *)(local_150.field_2._8_8_ + lVar11 + -0x30);
              *puVar3 = *puVar2;
              puVar3[1] = uVar6;
              puVar2 = (undefined8 *)(ptr + -0x20 + lVar11);
              uVar6 = puVar2[1];
              puVar3 = (undefined8 *)(local_150.field_2._8_8_ + lVar11 + -0x20);
              *puVar3 = *puVar2;
              puVar3[1] = uVar6;
              puVar2 = (undefined8 *)(ptr + -0x10 + lVar11);
              uVar6 = puVar2[1];
              puVar3 = (undefined8 *)(local_150.field_2._8_8_ + lVar11 + -0x10);
              *puVar3 = *puVar2;
              puVar3[1] = uVar6;
              uVar6 = ((undefined8 *)(ptr + lVar11))[1];
              *(undefined8 *)(local_150.field_2._8_8_ + lVar11) = *(undefined8 *)(ptr + lVar11);
              ((undefined8 *)(local_150.field_2._8_8_ + lVar11))[1] = uVar6;
              uVar14 = uVar14 + 1;
              lVar11 = lVar11 + 0x40;
            } while (uVar14 < local_150._M_string_length);
          }
          alignedFree((void *)ptr);
          uVar19 = local_68;
          uVar20 = fStack_64;
          uVar21 = fStack_60;
          uVar22 = fStack_5c;
          uVar23 = local_78;
          uVar24 = uStack_74;
          uVar25 = uStack_70;
          uVar26 = uStack_6c;
          uVar27 = local_88;
          uVar28 = uStack_84;
          uVar29 = uStack_80;
          uVar30 = uStack_7c;
          uVar31 = local_98;
          uVar32 = uStack_94;
          uVar33 = uStack_90;
          uVar34 = uStack_8c;
          local_150.field_2._M_allocated_capacity = uVar18;
        }
        local_150._M_string_length = sVar7 + 1;
        lVar11 = sVar7 * 0x40;
        pfVar1 = (float *)(local_150.field_2._8_8_ + lVar11);
        *pfVar1 = (float)uVar19;
        pfVar1[1] = (float)uVar20;
        pfVar1[2] = (float)uVar21;
        pfVar1[3] = (float)uVar22;
        puVar4 = (undefined4 *)(local_150.field_2._8_8_ + 0x10 + lVar11);
        *puVar4 = uVar23;
        puVar4[1] = uVar24;
        puVar4[2] = uVar25;
        puVar4[3] = uVar26;
        puVar4 = (undefined4 *)(local_150.field_2._8_8_ + 0x20 + lVar11);
        *puVar4 = uVar27;
        puVar4[1] = uVar28;
        puVar4[2] = uVar29;
        puVar4[3] = uVar30;
        puVar4 = (undefined4 *)(local_150.field_2._8_8_ + 0x30 + lVar11);
        *puVar4 = uVar31;
        puVar4[1] = uVar32;
        puVar4[2] = uVar33;
        puVar4[3] = uVar34;
      }
      if (pXVar5 != (XML *)0x0) {
        (*(pXVar5->super_RefCount)._vptr_RefCount[3])(pXVar5);
      }
      uVar17 = uVar17 + 1;
      pRVar10 = (xml->ptr->children).
                super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar17 < (ulong)((long)(xml->ptr->children).
                                    super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar10 >> 3)
            );
  }
  ppVar8 = local_e8;
  std::
  pair<embree::Ref<embree::SceneGraph::MaterialNode>,_embree::vector_t<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_embree::aligned_allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_16UL>_>_>
  ::
  pair<embree::Ref<embree::SceneGraph::MaterialNode>_&,_embree::vector_t<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_embree::aligned_allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_16UL>_>_&,_true>
            (local_e8,&local_158,
             (vector_t<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_embree::aligned_allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_16UL>_>
              *)&local_150);
  alignedFree((void *)local_150.field_2._8_8_);
  local_150._M_string_length = 0;
  local_150.field_2._M_allocated_capacity = 0;
  local_150.field_2._8_8_ = 0;
  if (&(local_158.ptr)->super_Node != (Node *)0x0) {
    (*((local_158.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  return ppVar8;
}

Assistant:

std::pair<Ref<SceneGraph::MaterialNode>, avector<AffineSpace3fa> > CoronaLoader::loadInstances(const Ref<XML>& xml) 
  {
    if (xml->name != "instance") 
      THROW_RUNTIME_ERROR(xml->loc.str()+": invalid instance node");

    /* create default material */
    Ref<SceneGraph::MaterialNode> material = new OBJMaterial;

    avector<AffineSpace3fa> xfms;
    for (size_t i=0; i<xml->children.size(); i++)
    {
      Ref<XML> child = xml->children[i];
      if      (child->name == "material" ) material = loadMaterial(child);
      else if (child->name == "transform") xfms.push_back(load<AffineSpace3fa>(child));
      else THROW_RUNTIME_ERROR(child->loc.str()+": unknown node: "+child->name);
    }

    return std::make_pair(material,xfms);
  }